

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O0

FT_Error PCF_Glyph_Load(FT_GlyphSlot slot,FT_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  short *psVar1;
  FT_Face pFVar2;
  FT_Stream stream_00;
  int iVar3;
  FT_Bitmap *pFVar4;
  size_t size_00;
  byte bVar5;
  FT_ULong bytes;
  PCF_Metric metric;
  FT_Bitmap *bitmap;
  FT_Error error;
  FT_Stream stream;
  PCF_Face face;
  FT_Int32 load_flags_local;
  FT_UInt glyph_index_local;
  FT_Size size_local;
  FT_GlyphSlot slot_local;
  
  pFVar2 = size->face;
  bitmap._4_4_ = 0;
  pFVar4 = &slot->bitmap;
  if (pFVar2 == (FT_Face)0x0) {
    bitmap._4_4_ = 0x23;
  }
  else if (glyph_index < (uint)pFVar2->num_glyphs) {
    stream_00 = pFVar2->stream;
    face._4_4_ = glyph_index;
    if (glyph_index != 0) {
      face._4_4_ = glyph_index - 1;
    }
    psVar1 = (short *)(pFVar2[2].num_glyphs + (ulong)face._4_4_ * 0x18);
    pFVar4->rows = (int)psVar1[3] + (int)psVar1[4];
    (slot->bitmap).width = (int)psVar1[1] - (int)*psVar1;
    (slot->bitmap).num_grays = 1;
    (slot->bitmap).pixel_mode = '\x01';
    bVar5 = *(byte *)&pFVar2[2].available_sizes & 3;
    if (7 < (1 << bVar5) - 1U) {
      return 3;
    }
    switch(bVar5) {
    case 0:
      (slot->bitmap).pitch = (slot->bitmap).width + 7 >> 3;
      break;
    case 1:
      (slot->bitmap).pitch = ((slot->bitmap).width + 0xf >> 4) << 1;
      break;
    case 2:
      (slot->bitmap).pitch = ((slot->bitmap).width + 0x1f >> 5) << 2;
      break;
    case 3:
      (slot->bitmap).pitch = ((slot->bitmap).width + 0x3f >> 6) << 3;
    }
    slot->format = FT_GLYPH_FORMAT_BITMAP;
    slot->bitmap_left = (int)*psVar1;
    slot->bitmap_top = (int)psVar1[3];
    (slot->metrics).horiAdvance = (long)((int)psVar1[2] << 6);
    (slot->metrics).horiBearingX = (long)((int)*psVar1 << 6);
    (slot->metrics).horiBearingY = (long)((int)psVar1[3] << 6);
    (slot->metrics).width = (long)(((int)psVar1[1] - (int)*psVar1) * 0x40);
    (slot->metrics).height = (ulong)(pFVar4->rows << 6);
    ft_synthesize_vertical_metrics
              (&slot->metrics,
               (*(long *)&pFVar2[1].units_per_EM + *(long *)&pFVar2[1].max_advance_width) * 0x40);
    if ((load_flags & 0x400000U) == 0) {
      size_00 = (long)(slot->bitmap).pitch * (ulong)pFVar4->rows;
      bitmap._4_4_ = ft_glyphslot_alloc_bitmap(slot,size_00);
      if (((bitmap._4_4_ == 0) &&
          (bitmap._4_4_ = FT_Stream_Seek(stream_00,*(FT_ULong *)(psVar1 + 8)), bitmap._4_4_ == 0))
         && (bitmap._4_4_ = FT_Stream_Read(stream_00,(slot->bitmap).buffer,size_00),
            bitmap._4_4_ == 0)) {
        if (((ulong)pFVar2[2].available_sizes & 8) == 0) {
          BitOrderInvert((slot->bitmap).buffer,size_00);
        }
        if (((((ulong)pFVar2[2].available_sizes & 4) != 0) !=
             (((ulong)pFVar2[2].available_sizes & 8) != 0)) &&
           (iVar3 = 1 << (sbyte)((*(uint *)&pFVar2[2].available_sizes & 0x30) >> 4), iVar3 != 1)) {
          if (iVar3 == 2) {
            TwoByteSwap((slot->bitmap).buffer,size_00);
          }
          else if (iVar3 == 4) {
            FourByteSwap((slot->bitmap).buffer,size_00);
          }
        }
      }
    }
  }
  else {
    bitmap._4_4_ = 6;
  }
  return bitmap._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  PCF_Glyph_Load( FT_GlyphSlot  slot,
                  FT_Size       size,
                  FT_UInt       glyph_index,
                  FT_Int32      load_flags )
  {
    PCF_Face    face   = (PCF_Face)FT_SIZE_FACE( size );
    FT_Stream   stream;
    FT_Error    error  = FT_Err_Ok;
    FT_Bitmap*  bitmap = &slot->bitmap;
    PCF_Metric  metric;
    FT_ULong    bytes;


    FT_TRACE1(( "PCF_Glyph_Load: glyph index %d\n", glyph_index ));

    if ( !face )
    {
      error = FT_THROW( Invalid_Face_Handle );
      goto Exit;
    }

    if ( glyph_index >= (FT_UInt)face->root.num_glyphs )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    stream = face->root.stream;

    if ( glyph_index > 0 )
      glyph_index--;

    metric = face->metrics + glyph_index;

    bitmap->rows       = (unsigned int)( metric->ascent +
                                         metric->descent );
    bitmap->width      = (unsigned int)( metric->rightSideBearing -
                                         metric->leftSideBearing );
    bitmap->num_grays  = 1;
    bitmap->pixel_mode = FT_PIXEL_MODE_MONO;

    switch ( PCF_GLYPH_PAD( face->bitmapsFormat ) )
    {
    case 1:
      bitmap->pitch = (int)( ( bitmap->width + 7 ) >> 3 );
      break;

    case 2:
      bitmap->pitch = (int)( ( ( bitmap->width + 15 ) >> 4 ) << 1 );
      break;

    case 4:
      bitmap->pitch = (int)( ( ( bitmap->width + 31 ) >> 5 ) << 2 );
      break;

    case 8:
      bitmap->pitch = (int)( ( ( bitmap->width + 63 ) >> 6 ) << 3 );
      break;

    default:
      return FT_THROW( Invalid_File_Format );
    }

    slot->format      = FT_GLYPH_FORMAT_BITMAP;
    slot->bitmap_left = metric->leftSideBearing;
    slot->bitmap_top  = metric->ascent;

    slot->metrics.horiAdvance  = (FT_Pos)( metric->characterWidth * 64 );
    slot->metrics.horiBearingX = (FT_Pos)( metric->leftSideBearing * 64 );
    slot->metrics.horiBearingY = (FT_Pos)( metric->ascent * 64 );
    slot->metrics.width        = (FT_Pos)( ( metric->rightSideBearing -
                                             metric->leftSideBearing ) * 64 );
    slot->metrics.height       = (FT_Pos)( bitmap->rows * 64 );

    ft_synthesize_vertical_metrics( &slot->metrics,
                                    ( face->accel.fontAscent +
                                      face->accel.fontDescent ) * 64 );

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      goto Exit;

    /* XXX: to do: are there cases that need repadding the bitmap? */
    bytes = (FT_ULong)bitmap->pitch * bitmap->rows;

    error = ft_glyphslot_alloc_bitmap( slot, (FT_ULong)bytes );
    if ( error )
      goto Exit;

    if ( FT_STREAM_SEEK( metric->bits )          ||
         FT_STREAM_READ( bitmap->buffer, bytes ) )
      goto Exit;

    if ( PCF_BIT_ORDER( face->bitmapsFormat ) != MSBFirst )
      BitOrderInvert( bitmap->buffer, bytes );

    if ( ( PCF_BYTE_ORDER( face->bitmapsFormat ) !=
           PCF_BIT_ORDER( face->bitmapsFormat )  ) )
    {
      switch ( PCF_SCAN_UNIT( face->bitmapsFormat ) )
      {
      case 1:
        break;

      case 2:
        TwoByteSwap( bitmap->buffer, bytes );
        break;

      case 4:
        FourByteSwap( bitmap->buffer, bytes );
        break;
      }
    }

  Exit:
    return error;
  }